

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O2

int WI_drawLF(void)

{
  int iVar1;
  
  iVar1 = WI_DrawName(CleanYfac * 2,wbs->LName0,lnametexts[0].Chars);
  iVar1 = (((mapname.mFont)->FontHeight - (finished.mFont)->FontHeight) * CleanYfac) / -4 + iVar1;
  if (iVar1 < (((finished.mFont)->FontHeight * 3) / -4 + 0x32) * CleanYfac) {
    iVar1 = WI_DrawPatchText(iVar1,&finished,"WI_FINISHED");
    return iVar1;
  }
  return iVar1;
}

Assistant:

int WI_drawLF ()
{
	int y = WI_TITLEY * CleanYfac;

	y = WI_DrawName(y, wbs->LName0, lnametexts[0]);
	
	// Adjustment for different font sizes for map name and 'finished'.
	y -= ((mapname.mFont->GetHeight() - finished.mFont->GetHeight()) * CleanYfac) / 4;

	// draw "Finished!"
	if (y < (NG_STATSY - finished.mFont->GetHeight()*3/4) * CleanYfac)
	{
		// don't draw 'finished' if the level name is too tall
		y = WI_DrawPatchText(y, &finished, "WI_FINISHED");
	}
	return y;
}